

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O2

void spell_calm(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,(int)gsn_rage);
  if (bVar1) {
    bVar1 = is_affected(ch,sn);
    if (!bVar1) {
      iVar2 = number_percent();
      iVar3 = get_skill(ch,sn);
      if (iVar2 <= iVar3) {
        iVar2 = skill_lookup("rage");
        switchD_00333f01::default(ch,iVar2);
        init_affect(&AStack_88);
        AStack_88.where = 0;
        AStack_88.type = (short)sn;
        AStack_88.aftype = 2;
        AStack_88.modifier = -8;
        AStack_88.duration = 3;
        AStack_88.location = 0x12;
        AStack_88.level = (short)level;
        affect_to_char(ch,&AStack_88);
        AStack_88.location = 0x13;
        affect_to_char(ch,&AStack_88);
        send_to_char("You manage to snap out of your rage.\n\r",ch);
        return;
      }
      txt = "You try to calm yourself but your rage overcomes you.\n\r";
      goto LAB_003221cb;
    }
  }
  txt = "Calm yourself?  You don\'t feel very angry.\n\r";
LAB_003221cb:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_calm(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (!is_affected(ch, gsn_rage) || is_affected(ch, sn))
	{
		send_to_char("Calm yourself?  You don't feel very angry.\n\r", ch);
		return;
	}

	if (number_percent() > get_skill(ch, sn))
	{
		send_to_char("You try to calm yourself but your rage overcomes you.\n\r", ch);
		return;
	}

	affect_strip(ch, skill_lookup("rage"));
	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = AFT_POWER;
	af.modifier = -8;
	af.level = level;
	af.duration = 3;
	af.location = APPLY_HITROLL;
	affect_to_char(ch, &af);

	af.location = APPLY_DAMROLL;
	affect_to_char(ch, &af);

	send_to_char("You manage to snap out of your rage.\n\r", ch);
}